

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressPNG.cpp
# Opt level: O3

size_t __thiscall
adios2::core::compress::CompressPNG::Operate
          (CompressPNG *this,char *dataIn,Dims *blockStart,Dims *blockCount,DataType type,
          char *bufferOut)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppuVar2;
  size_type sVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  _Rb_tree_color _Var7;
  int32_t iVar8;
  long *plVar9;
  size_type *psVar10;
  const_iterator cVar11;
  _Rb_tree_node_base *p_Var12;
  mapped_type *pmVar13;
  _Rb_tree_header *p_Var14;
  long *plVar15;
  undefined8 *puVar16;
  png_structp ppVar17;
  png_infop ppVar18;
  size_t sVar19;
  ulong *puVar20;
  __jmp_buf_tag *__env;
  _Base_ptr p_Var21;
  ulong uVar22;
  _Base_ptr p_Var23;
  _Rb_tree_color __val;
  uint __len;
  ulong uVar24;
  char cVar25;
  uint uVar26;
  _Rb_tree_color _Var27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  string local_188;
  string value;
  string local_148;
  png_structp pngWrite;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  png_infop pngInfo;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  int32_t local_c8;
  DataType local_c4;
  string colorTypeStr;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string __str_1;
  
  *bufferOut = (this->super_Operator).m_TypeEnum;
  bufferOut[1] = '\x01';
  bufferOut[2] = '\0';
  bufferOut[3] = '\0';
  lVar28 = (long)(blockCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(blockCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  uVar29 = lVar28 >> 3;
  paVar1 = &colorTypeStr.field_2;
  local_c4 = type;
  if (uVar29 - 4 < 0xfffffffffffffffe) {
    colorTypeStr._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&colorTypeStr,"Operator","");
    pppuVar2 = &rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppuVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"CompressPNG","");
    value._M_dataplus._M_p = (pointer)&value.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"Operate","");
    cVar25 = '\x01';
    if (9 < uVar29) {
      uVar22 = uVar29;
      cVar5 = '\x04';
      do {
        cVar25 = cVar5;
        if (uVar22 < 100) {
          cVar25 = cVar25 + -2;
          goto LAB_006ed2eb;
        }
        if (uVar22 < 1000) {
          cVar25 = cVar25 + -1;
          goto LAB_006ed2eb;
        }
        if (uVar22 < 10000) goto LAB_006ed2eb;
        bVar30 = 99999 < uVar22;
        uVar22 = uVar22 / 10000;
        cVar5 = cVar25 + '\x04';
      } while (bVar30);
      cVar25 = cVar25 + '\x01';
    }
LAB_006ed2eb:
    pngWrite = (png_structp)&local_118;
    std::__cxx11::string::_M_construct((ulong)&pngWrite,cVar25);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)pngWrite,(uint)local_120,uVar29);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&pngWrite,0,(char *)0x0,0x759a73);
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_148.field_2._M_allocated_capacity = *psVar10;
      local_148.field_2._8_8_ = plVar9[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar10;
      local_148._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_148._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_188.field_2._M_allocated_capacity = *psVar10;
      local_188.field_2._8_8_ = plVar9[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar10;
      local_188._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_188._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    helper::Throw<std::invalid_argument>(&colorTypeStr,(string *)&rows,&value,&local_188,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pngWrite != &local_118) {
      operator_delete(pngWrite);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value._M_dataplus._M_p != &value.field_2) {
      operator_delete(value._M_dataplus._M_p);
    }
    if ((pointer *)
        rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != pppuVar2) {
      operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)colorTypeStr._M_dataplus._M_p != paVar1) {
      operator_delete(colorTypeStr._M_dataplus._M_p);
    }
  }
  colorTypeStr._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorTypeStr,"PNG_COLOR_TYPE_RGBA","");
  p_Var12 = (this->super_Operator).m_Parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  p_Var14 = &(this->super_Operator).m_Parameters._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 == p_Var14) {
    iVar8 = 1;
    _Var27 = 6;
    _Var7 = 8;
  }
  else {
    _Var7 = 8;
    _Var27 = 6;
    iVar8 = 1;
    do {
      rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rows,*(long *)(p_Var12 + 1),
                 (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
      value._M_dataplus._M_p = (pointer)&value.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&value,*(long *)(p_Var12 + 2),
                 (long)&(p_Var12[2]._M_parent)->_M_color + *(long *)(p_Var12 + 2));
      iVar6 = std::__cxx11::string::compare((char *)&rows);
      if (iVar6 == 0) {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"when setting PNG level parameter\n","");
        iVar8 = helper::StringTo<int>(&value,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (iVar8 - 10U < 0xfffffff7) {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Operator","");
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"CompressPNG","");
          pngWrite = (png_structp)&local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&pngWrite,"Operate","");
          pngInfo = (png_infop)&local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&pngInfo,
                     "compression_level must be an integer between 1 (less compression, less memory) and 9 (more compression, more memory) inclusive, in call to ADIOS2 PNG Compress"
                     ,"");
          helper::Throw<std::invalid_argument>
                    (&local_188,&local_148,(string *)&pngWrite,(string *)&pngInfo,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pngInfo != &local_d8) {
            operator_delete(pngInfo);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pngWrite != &local_118) {
            operator_delete(pngWrite);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&rows);
        if (iVar6 == 0) {
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)m_ColorTypes_abi_cxx11_,&value);
          if (cVar11._M_node == (_Base_ptr)(m_ColorTypes_abi_cxx11_ + 8)) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Operator","");
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"CompressPNG","");
            pngWrite = (png_structp)&local_118;
            std::__cxx11::string::_M_construct<char_const*>((string *)&pngWrite,"Operate","");
            pngInfo = (png_infop)&local_d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&pngInfo,
                       "invalid color_type, see PNG_COLOR_TYPE_* for available types, in call to ADIOS2 PNG Compress"
                       ,"");
            helper::Throw<std::invalid_argument>
                      (&local_188,&local_148,(string *)&pngWrite,(string *)&pngInfo,-1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pngInfo != &local_d8) {
              operator_delete(pngInfo);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pngWrite != &local_118) {
              operator_delete(pngWrite);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
          }
          std::__cxx11::string::_M_assign((string *)&colorTypeStr);
          _Var27 = cVar11._M_node[2]._M_color;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&rows);
          if (iVar6 == 0) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"when setting PNG bit_depth parameter\n","");
            _Var7 = helper::StringTo<int>(&value,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p);
      }
      if ((pointer *)
          rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var14);
  }
  local_c8 = iVar8;
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                  *)m_BitDepths_abi_cxx11_,&colorTypeStr);
  p_Var23 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var23 != (_Base_ptr)0x0) {
    p_Var14 = &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
    p_Var21 = &p_Var14->_M_header;
    do {
      bVar30 = p_Var23[1]._M_color < _Var7;
      if (!bVar30) {
        p_Var21 = p_Var23;
      }
      p_Var23 = (&p_Var23->_M_left)[bVar30];
    } while (p_Var23 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var21 != p_Var14) && (p_Var21[1]._M_color <= _Var7))
    goto LAB_006edc34;
  }
  pppuVar2 = &rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppuVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"Operator","");
  value._M_dataplus._M_p = (pointer)&value.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"CompressPNG","");
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Operate","");
  __val = -_Var7;
  if (0 < (int)_Var7) {
    __val = _Var7;
  }
  __len = 1;
  if (9 < __val) {
    uVar29 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar26 = (uint)uVar29;
      if (uVar26 < 100) {
        __len = __len - 2;
        goto LAB_006ed9ad;
      }
      if (uVar26 < 1000) {
        __len = __len - 1;
        goto LAB_006ed9ad;
      }
      if (uVar26 < 10000) goto LAB_006ed9ad;
      uVar29 = uVar29 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar26);
    __len = __len + 1;
  }
LAB_006ed9ad:
  __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str_1,(char)__len - (char)((int)_Var7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (__str_1._M_dataplus._M_p + (_Var7 >> 0x1f),__len,__val);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x759c7a);
  local_70 = &local_60;
  plVar15 = plVar9 + 2;
  if ((long *)*plVar9 == plVar15) {
    local_60 = *plVar15;
    lStack_58 = plVar9[3];
  }
  else {
    local_60 = *plVar15;
    local_70 = (long *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)plVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
  ppVar18 = (png_infop)(plVar9 + 2);
  if ((png_infop)*plVar9 == ppVar18) {
    local_d8._M_allocated_capacity = *(undefined8 *)ppVar18;
    local_d8._8_8_ = plVar9[3];
    pngInfo = (png_infop)&local_d8;
  }
  else {
    local_d8._M_allocated_capacity = *(undefined8 *)ppVar18;
    pngInfo = (png_infop)*plVar9;
  }
  local_e0 = plVar9[1];
  *plVar9 = (long)ppVar18;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&pngInfo,(ulong)colorTypeStr._M_dataplus._M_p);
  ppVar17 = (png_structp)(plVar9 + 2);
  if ((png_structp)*plVar9 == ppVar17) {
    local_118._M_allocated_capacity = *(undefined8 *)ppVar17;
    local_118._8_8_ = plVar9[3];
    pngWrite = (png_structp)&local_118;
  }
  else {
    local_118._M_allocated_capacity = *(undefined8 *)ppVar17;
    pngWrite = (png_structp)*plVar9;
  }
  local_120 = plVar9[1];
  *plVar9 = (long)ppVar17;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&pngWrite);
  psVar10 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_148.field_2._M_allocated_capacity = *psVar10;
    local_148.field_2._8_8_ = puVar16[3];
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar10;
    local_148._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_148._M_string_length = puVar16[1];
  *puVar16 = psVar10;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  helper::Throw<std::invalid_argument>((string *)&rows,&value,&local_188,&local_148,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pngWrite != &local_118) {
    operator_delete(pngWrite);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pngInfo != &local_d8) {
    operator_delete(pngInfo);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p);
  }
  if ((pointer *)
      rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != pppuVar2) {
    operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_006edc34:
  ppVar17 = (png_structp)png_create_write_struct("1.6.37",0,0);
  pngWrite = ppVar17;
  ppVar18 = (png_infop)png_create_info_struct(ppVar17);
  pngInfo = ppVar18;
  if (lVar28 == 0x18) {
    puVar20 = (blockCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar19 = (size_t)(uint)puVar20[2];
  }
  else {
    sVar19 = helper::GetDataTypeSize(local_c4);
    puVar20 = (blockCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  uVar29 = *puVar20;
  uVar22 = puVar20[1];
  png_set_IHDR(ppVar17,ppVar18,uVar22 & 0xffffffff,uVar29,_Var7,_Var27,0,0,0);
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar17,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 != 0) {
    rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"Operator","");
    value._M_dataplus._M_p = (pointer)&value.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"CompressPNG","");
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Operate","");
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"libpng detected an error in ADIOS2 PNG Compress","");
    helper::Throw<std::invalid_argument>((string *)&rows,&value,&local_188,&local_148,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value._M_dataplus._M_p != &value.field_2) {
      operator_delete(value._M_dataplus._M_p);
    }
    if ((pointer *)
        rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  png_set_compression_level(ppVar17,local_c8);
  uVar29 = uVar29 & 0xffffffff;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            (&rows,uVar29,(allocator_type *)&value);
  if (uVar29 != 0) {
    uVar24 = 0;
    do {
      rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar24] = (uchar *)dataIn;
      uVar24 = uVar24 + 1;
      dataIn = (char *)((uchar *)dataIn + (sVar19 & 0xffffffff) * (uVar22 & 0xffffffff));
    } while (uVar29 != uVar24);
  }
  png_set_rows(ppVar17,ppVar18,
               rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  value._M_string_length = 0xf;
  value._M_dataplus._M_p = bufferOut;
  png_set_write_fn(ppVar17,&value,Operate::anon_class_1_0_00000001::__invoke,0);
  png_write_png(ppVar17,ppVar18,0,0);
  png_write_end(ppVar17,ppVar18);
  png_destroy_write_struct(&pngWrite,&pngInfo);
  sVar3 = value._M_string_length;
  *(size_type *)(bufferOut + 4) = value._M_string_length;
  bufferOut[0xc] = '\x01';
  bufferOut[0xd] = '\x06';
  bufferOut[0xe] = '%';
  if (rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorTypeStr._M_dataplus._M_p != &colorTypeStr.field_2) {
    operator_delete(colorTypeStr._M_dataplus._M_p);
  }
  return sVar3;
}

Assistant:

size_t CompressPNG::Operate(const char *dataIn, const Dims &blockStart, const Dims &blockCount,
                            const DataType type, char *bufferOut)
{
    size_t bufferOutOffset = 0;
    const uint8_t bufferVersion = 1;

    MakeCommonHeader(bufferOut, bufferOutOffset, bufferVersion);

    size_t paramOffset = bufferOutOffset;
    bufferOutOffset += sizeof(size_t) + 3;

    auto lf_Write = [](png_structp png_ptr, png_bytep data, png_size_t length) {
        DestInfo *pDestInfo = reinterpret_cast<DestInfo *>(png_get_io_ptr(png_ptr));
        std::memcpy(pDestInfo->BufferOut + pDestInfo->Offset, data, length);
        pDestInfo->Offset += length;
    };

    const std::size_t ndims = blockCount.size();

    if (ndims != 3 && ndims != 2)
    {
        helper::Throw<std::invalid_argument>(
            "Operator", "CompressPNG", "Operate",
            "image number of dimensions " + std::to_string(ndims) +
                " is invalid, must be 2 {height,width*bytes_per_pixel} or 3"
                " {height,width,bytes_per_pixel]} , in call to ADIOS2 PNG "
                " compression");
    }

    // defaults
    int compressionLevel = 1;
    int colorType = PNG_COLOR_TYPE_RGBA;
    int bitDepth = 8;
    std::string colorTypeStr = "PNG_COLOR_TYPE_RGBA";

    for (const auto &itParameter : m_Parameters)
    {
        const std::string key = itParameter.first;
        const std::string value = itParameter.second;

        if (key == "compression_level")
        {
            compressionLevel = static_cast<int>(
                helper::StringTo<int32_t>(value, "when setting PNG level parameter\n"));

            if (compressionLevel < 1 || compressionLevel > 9)
            {
                helper::Throw<std::invalid_argument>(
                    "Operator", "CompressPNG", "Operate",
                    "compression_level must be an "
                    "integer between 1 (less "
                    "compression, less memory) and 9 "
                    "(more compression, more memory) inclusive, in call to "
                    "ADIOS2 PNG Compress");
            }
        }
        else if (key == "color_type")
        {
            auto itColorType = m_ColorTypes.find(value);

            if (itColorType == m_ColorTypes.end())
            {
                helper::Throw<std::invalid_argument>(
                    "Operator", "CompressPNG", "Operate",
                    "invalid color_type, see PNG_COLOR_TYPE_* for "
                    "available types, in call to ADIOS2 PNG Compress");
            }

            colorTypeStr = itColorType->first;
            colorType = itColorType->second;
        }
        else if (key == "bit_depth")
        {
            bitDepth = static_cast<int>(
                helper::StringTo<int32_t>(value, "when setting PNG bit_depth parameter\n"));
        }
    }

    if (m_BitDepths.at(colorTypeStr).count(static_cast<int32_t>(bitDepth)) == 0)
    {
        helper::Throw<std::invalid_argument>(
            "Operator", "CompressPNG", "Operate",
            "bit_depth " + std::to_string(bitDepth) + " and color_type " + colorTypeStr +
                " combination is not allowed by libpng, in call to ADIOS2 PNG "
                "compression");
    }

    png_structp pngWrite =
        png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
    png_infop pngInfo = png_create_info_struct(pngWrite);

    const uint32_t bytesPerPixel = ndims == 3
                                       ? static_cast<uint32_t>(blockCount[2])
                                       : static_cast<uint32_t>(helper::GetDataTypeSize(type));

    const uint32_t width = static_cast<uint32_t>(blockCount[1]);
    const uint32_t height = static_cast<uint32_t>(blockCount[0]);

    png_set_IHDR(pngWrite, pngInfo, width, height, bitDepth, colorType, PNG_INTERLACE_NONE,
                 PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    if (setjmp(png_jmpbuf(pngWrite)))
    {
        helper::Throw<std::invalid_argument>("Operator", "CompressPNG", "Operate",
                                             "libpng detected an error in ADIOS2 PNG Compress");
    }

    png_set_compression_level(pngWrite, compressionLevel);

    // set the rows
    std::vector<uint8_t *> rows(height);
    for (size_t r = 0; r < height; ++r)
    {
        rows[r] =
            reinterpret_cast<uint8_t *>(const_cast<char *>(dataIn)) + r * width * bytesPerPixel;
    }
    png_set_rows(pngWrite, pngInfo, rows.data());

    DestInfo destInfo;
    destInfo.BufferOut = bufferOut;
    destInfo.Offset = bufferOutOffset;

    png_set_write_fn(pngWrite, &destInfo, lf_Write, nullptr);
    png_write_png(pngWrite, pngInfo, PNG_TRANSFORM_IDENTITY, nullptr);
    png_write_end(pngWrite, pngInfo);

    // const size_t compressedSize = png_get_compression_buffer_size(pngWrite);
    png_destroy_write_struct(&pngWrite, &pngInfo);

    PutParameter(bufferOut, paramOffset, destInfo.Offset);
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_MAJOR));
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_MINOR));
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_RELEASE));

    return destInfo.Offset;
}